

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

Violation mp::
          ComputeViolation<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::AndId,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AndId>
                     *c,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  CtxVal CVar4;
  pointer pdVar5;
  int *piVar6;
  double dVar7;
  double dVar8;
  Violation VVar9;
  Violation VVar10;
  Violation VVar11;
  
  iVar3 = (c->super_FunctionalConstraint).result_var_;
  pdVar5 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar2 = pdVar5[iVar3];
  if (x->recomp_vals_ == false) {
    dVar7 = 1.0;
    for (piVar6 = (c->
                  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AndId>
                  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar6 != (c->
                  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AndId>
                  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
      pdVar1 = pdVar5 + *piVar6;
      if (*pdVar1 <= 0.5 && *pdVar1 != 0.5) {
        dVar7 = 0.0;
        break;
      }
    }
    dVar7 = dVar2 - dVar7;
    CVar4 = (c->super_FunctionalConstraint).ctx.value_;
    if (CVar4 != CTX_POS) {
      if (CVar4 == CTX_NEG) {
        VVar11.viol_ = -dVar7;
        VVar11.valX_ = dVar2;
        return VVar11;
      }
      if (CVar4 == CTX_MIX) {
        VVar10.viol_ = ABS(dVar7);
        VVar10.valX_ = dVar2;
        return VVar10;
      }
      return (Violation)ZEXT816(0x7ff0000000000000);
    }
  }
  else {
    dVar8 = (x->lb_).data_[iVar3] - dVar2;
    dVar7 = dVar2 - (x->ub_).data_[iVar3];
    if (dVar7 <= dVar8) {
      dVar7 = dVar8;
    }
    if (dVar7 <= 0.0) {
      dVar7 = 0.0;
    }
    dVar7 = dVar7 + ABS(dVar2 - (x->x_raw_).data_[iVar3]);
  }
  VVar9.valX_ = dVar2;
  VVar9.viol_ = dVar7;
  return VVar9;
}

Assistant:

int GetResultVar() const { return result_var_; }